

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O1

c_float compute_pri_tol(OSQPWorkspace *work,c_float eps_abs,c_float eps_rel)

{
  double dVar1;
  double local_20;
  
  if ((work->settings->scaling == 0) || (work->settings->scaled_termination != 0)) {
    local_20 = vec_norm_inf(work->z,work->data->m);
    dVar1 = vec_norm_inf(work->Ax,work->data->m);
  }
  else {
    local_20 = vec_scaled_norm_inf(work->scaling->Einv,work->z,work->data->m);
    dVar1 = vec_scaled_norm_inf(work->scaling->Einv,work->Ax,work->data->m);
  }
  if (local_20 <= dVar1) {
    local_20 = dVar1;
  }
  return eps_rel * local_20 + eps_abs;
}

Assistant:

c_float compute_pri_tol(OSQPWorkspace *work, c_float eps_abs, c_float eps_rel) {
  c_float max_rel_eps, temp_rel_eps;

  // max_rel_eps = max(||z||, ||A x||)
  if (work->settings->scaling && !work->settings->scaled_termination) {
    // ||Einv * z||
    max_rel_eps =
      vec_scaled_norm_inf(work->scaling->Einv, work->z, work->data->m);

    // ||Einv * A * x||
    temp_rel_eps = vec_scaled_norm_inf(work->scaling->Einv,
                                       work->Ax,
                                       work->data->m);

    // Choose maximum
    max_rel_eps = c_max(max_rel_eps, temp_rel_eps);
  } else { // No unscaling required
    // ||z||
    max_rel_eps = vec_norm_inf(work->z, work->data->m);

    // ||A * x||
    temp_rel_eps = vec_norm_inf(work->Ax, work->data->m);

    // Choose maximum
    max_rel_eps = c_max(max_rel_eps, temp_rel_eps);
  }

  // eps_prim
  return eps_abs + eps_rel * max_rel_eps;
}